

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O1

int mbedtls_ecdh_read_params(mbedtls_ecdh_context *ctx,uchar **buf,uchar *end)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_tls_read_group(&ctx->grp,buf,(long)end - (long)*buf);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_ecp_tls_read_point(&ctx->grp,&ctx->Qp,buf,(long)end - (long)*buf);
  return iVar1;
}

Assistant:

int mbedtls_ecdh_read_params( mbedtls_ecdh_context *ctx,
                      const unsigned char **buf, const unsigned char *end )
{
    int ret;

    if( ( ret = mbedtls_ecp_tls_read_group( &ctx->grp, buf, end - *buf ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_ecp_tls_read_point( &ctx->grp, &ctx->Qp, buf, end - *buf ) )
                != 0 )
        return( ret );

    return( 0 );
}